

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O0

int LZ4_resetStreamStateHC(void *state,char *inputBuffer)

{
  LZ4_streamHC_t *hc4_00;
  LZ4_streamHC_t *hc4;
  char *inputBuffer_local;
  void *state_local;
  
  hc4_00 = LZ4_initStreamHC(state,0x40038);
  if (hc4_00 != (LZ4_streamHC_t *)0x0) {
    LZ4HC_init_internal(&hc4_00->internal_donotuse,(BYTE *)inputBuffer);
  }
  state_local._4_4_ = (uint)(hc4_00 == (LZ4_streamHC_t *)0x0);
  return state_local._4_4_;
}

Assistant:

int LZ4_resetStreamStateHC(void* state, char* inputBuffer)
{
    LZ4_streamHC_t* const hc4 = LZ4_initStreamHC(state, sizeof(*hc4));
    if (hc4 == NULL) return 1;   /* init failed */
    LZ4HC_init_internal (&hc4->internal_donotuse, (const BYTE*)inputBuffer);
    return 0;
}